

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3HexToBlob(sqlite3 *db,char *z,int n)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  int in_EDX;
  long in_RSI;
  int i;
  char *zBlob;
  u64 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_24;
  
  pvVar4 = sqlite3DbMallocRawNN
                     ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
  if (pvVar4 != (void *)0x0) {
    for (local_24 = 0; local_24 < in_EDX + -1; local_24 = local_24 + 2) {
      uVar1 = sqlite3HexToInt((int)*(char *)(in_RSI + local_24));
      bVar2 = uVar1 << 4;
      bVar3 = sqlite3HexToInt((int)*(char *)(in_RSI + (local_24 + 1)));
      *(byte *)((long)pvVar4 + (long)(local_24 / 2)) = bVar2 | bVar3;
    }
    *(undefined1 *)((long)pvVar4 + (long)(local_24 / 2)) = 0;
  }
  return pvVar4;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HexToBlob(sqlite3 *db, const char *z, int n){
  char *zBlob;
  int i;

  zBlob = (char *)sqlite3DbMallocRawNN(db, n/2 + 1);
  n--;
  if( zBlob ){
    for(i=0; i<n; i+=2){
      zBlob[i/2] = (sqlite3HexToInt(z[i])<<4) | sqlite3HexToInt(z[i+1]);
    }
    zBlob[i/2] = 0;
  }
  return zBlob;
}